

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_llwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGv_i64 ret;
  TCGv_i64 lo;
  TCGv_i64 hi;
  TCGv_i64 tmp2;
  TCGv_i64 tmp1;
  TCGv_i64 tval;
  TCGv_i64 taddr;
  TCGContext_conflict6 *tcg_ctx;
  uint32_t reg2_local;
  uint32_t reg1_local;
  int16_t offset_local;
  uint32_t base_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  lo = tcg_temp_new_i64(tcg_ctx_00);
  hi = tcg_temp_new_i64(tcg_ctx_00);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  tcg_gen_qemu_ld64(tcg_ctx_00,ret,addr,ctx->mem_idx);
  tcg_gen_extr32_i64_mips64el(tcg_ctx_00,lo,hi,ret);
  gen_store_gpr(tcg_ctx_00,lo,reg1);
  tcg_temp_free_i64(tcg_ctx_00,lo);
  gen_store_gpr(tcg_ctx_00,hi,reg2);
  tcg_temp_free_i64(tcg_ctx_00,hi);
  tcg_gen_st_i64_mips64el(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x790);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_gen_st_i64_mips64el(tcg_ctx_00,addr,tcg_ctx_00->cpu_env,0x780);
  tcg_temp_free_i64(tcg_ctx_00,addr);
  return;
}

Assistant:

static void gen_llwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);
    tcg_gen_qemu_ld64(tcg_ctx, tval, taddr, ctx->mem_idx);
#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_extr_i64_tl(tcg_ctx, tmp2, tmp1, tval);
#else
    tcg_gen_extr_i64_tl(tcg_ctx, tmp1, tmp2, tval);
#endif
    gen_store_gpr(tcg_ctx, tmp1, reg1);
    tcg_temp_free(tcg_ctx, tmp1);
    gen_store_gpr(tcg_ctx, tmp2, reg2);
    tcg_temp_free(tcg_ctx, tmp2);
    tcg_gen_st_i64(tcg_ctx, tval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_temp_free_i64(tcg_ctx, tval);
    tcg_gen_st_tl(tcg_ctx, taddr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_temp_free(tcg_ctx, taddr);
}